

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-to-double.cc
# Opt level: O1

double double_conversion::RadixStringToIeee<4,char_const*>
                 (char **current,char *end,bool sign,uc16 separator,bool parse_as_hex_float,
                 bool allow_trailing_junk,double junk_string_value,bool read_as_double,
                 bool *result_is_junk)

{
  byte bVar1;
  int iVar2;
  char cVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  byte bVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  undefined7 in_register_00000011;
  Double *pDVar14;
  Double *extraout_RDX;
  byte bVar15;
  long lVar16;
  Double *this;
  undefined3 in_register_00000089;
  byte *pbVar17;
  double dVar18;
  DiyFp diy_fp;
  char *local_98;
  undefined4 local_90;
  undefined4 local_8c;
  double local_88;
  byte *local_78;
  ulong local_70;
  ulong local_68;
  uint local_5c;
  undefined8 local_58;
  ulong local_50;
  long local_48;
  undefined8 local_40;
  long local_38;
  
  local_8c = CONCAT31(in_register_00000089,allow_trailing_junk);
  *result_is_junk = true;
  local_98 = end;
  local_88 = junk_string_value;
  local_78 = (byte *)end;
  while (**current == '0') {
    bVar5 = Advance<char_const*>(current,separator,0x10,&local_98);
    if (bVar5) {
      *result_is_junk = false;
      if (sign) {
        return -0.0;
      }
      return 0.0;
    }
  }
  local_90 = (undefined4)CONCAT71(in_register_00000011,sign);
  local_40 = 0x18;
  if (read_as_double) {
    local_40 = 0x35;
  }
  local_50 = 1L << (sbyte)local_40;
  cVar3 = (char)local_8c;
  local_70 = 0;
  local_58 = 5;
  local_48 = 4;
  pbVar17 = (byte *)*current;
  bVar15 = *pbVar17;
  iVar7 = (int)(char)bVar15;
  uVar8 = iVar7 - 0x30;
  if (9 < uVar8) {
    if ((byte)(bVar15 + 0x9f) < 6) {
      uVar8 = iVar7 - 0x57;
    }
    else {
      if (5 < (byte)(bVar15 + 0xbf)) {
        if (parse_as_hex_float) {
          if (bVar15 == 0x2e) {
            Advance<char_const*>(current,separator,0x10,&local_98);
            local_70 = CONCAT71(extraout_var_00,1);
            dVar18 = (double)(*(code *)(&DAT_02cc1b20 + *(int *)(&DAT_02cc1b20 + local_48 * 4)))();
            return dVar18;
          }
          if ((!parse_as_hex_float) || ((bVar15 | 0x20) != 0x70)) goto LAB_003eb224;
        }
        else {
LAB_003eb224:
          if ((char)local_8c == '\0') {
            bVar5 = pbVar17 != local_78;
            if ((bVar5) && (bVar6 = isWhitespace((int)(char)*pbVar17), bVar6)) {
              do {
                pbVar17 = pbVar17 + 1;
                *current = (char *)pbVar17;
                bVar5 = pbVar17 != local_78;
                if (pbVar17 == local_78) break;
                bVar6 = isWhitespace((int)(char)*pbVar17);
              } while (bVar6);
            }
            if (bVar5) {
              return local_88;
            }
            uVar8 = 5;
            goto LAB_003eb178;
          }
        }
        uVar8 = 5;
        goto LAB_003eb178;
      }
      uVar8 = iVar7 - 0x37;
    }
  }
  lVar16 = (long)(int)uVar8;
  uVar9 = lVar16 >> (sbyte)local_40;
  if ((int)uVar9 == 0) {
    bVar5 = Advance<char_const*>(current,separator,0x10,&local_98);
    uVar8 = (uint)bVar5 + (uint)bVar5 * 4;
LAB_003eb178:
    dVar18 = (double)(*(code *)(&DAT_02cc1b20 + *(int *)(&DAT_02cc1b20 + (ulong)uVar8 * 4)))();
    return dVar18;
  }
  iVar7 = 1;
  if (1 < (int)uVar9) {
    uVar11 = uVar9 & 0xffffffff;
    do {
      iVar7 = iVar7 + 1;
      uVar11 = uVar11 >> 1;
      uVar8 = (uint)uVar9;
      uVar9 = uVar11;
    } while (3 < uVar8);
  }
  bVar10 = (byte)iVar7;
  local_5c = -1 << (bVar10 & 0x1f);
  local_68 = lVar16 >> (bVar10 & 0x3f);
  local_38 = lVar16;
  bVar5 = Advance<char_const*>(current,separator,0x10,&local_98);
  bVar15 = 1;
  while (!bVar5) {
    if ((parse_as_hex_float) && (**current == '.')) {
      Advance<char_const*>(current,separator,0x10,&local_98);
      local_70 = CONCAT71(extraout_var,1);
    }
    bVar1 = **current;
    if ((0x3f < (char)bVar1 || 9 < (int)(char)bVar1 - 0x30U) &&
       ((uVar8 = bVar1 - 0x41, 0x25 < uVar8 || ((0x3f0000003fU >> ((ulong)uVar8 & 0x3f) & 1) == 0)))
       ) break;
    bVar15 = bVar15 & bVar1 == 0x30;
    iVar2 = iVar7 + 4;
    if ((local_70 & 1) != 0) {
      iVar2 = iVar7;
    }
    bVar5 = Advance<char_const*>(current,separator,0x10,&local_98);
    iVar7 = iVar2;
  }
  if (!parse_as_hex_float && cVar3 == '\0') {
    pbVar17 = (byte *)*current;
    bVar5 = pbVar17 != local_78;
    if ((bVar5) && (bVar6 = isWhitespace((int)(char)*pbVar17), bVar6)) {
      do {
        pbVar17 = pbVar17 + 1;
        *current = (char *)pbVar17;
        bVar5 = pbVar17 != local_78;
        if (pbVar17 == local_78) break;
        bVar6 = isWhitespace((int)(char)*pbVar17);
      } while (bVar6);
    }
    uVar8 = 1;
    if (bVar5) goto LAB_003eb178;
  }
  uVar12 = (uint)local_38 & ~local_5c;
  pDVar14 = (Double *)(ulong)uVar12;
  uVar8 = 1 << (bVar10 - 1 & 0x1f);
  if ((int)uVar8 < (int)uVar12) {
    bVar5 = (local_50 & local_68 + 1) != 0;
    this = (Double *)((long)(local_68 + 1) >> bVar5);
  }
  else {
    uVar9 = local_68;
    if (uVar12 == uVar8) {
      uVar9 = local_68 + ((byte)(~bVar15 | (byte)local_68) & 1);
    }
    bVar5 = (local_50 & uVar9) != 0;
    pDVar14 = (Double *)((long)uVar9 >> bVar5);
    this = pDVar14;
  }
  uVar8 = iVar7 + (uint)bVar5;
  *result_is_junk = false;
  if (!parse_as_hex_float) goto LAB_003eb365;
  Advance<char_const*>(current,separator,0x10,&local_98);
  bVar5 = false;
  bVar6 = false;
  if (**current == '+') {
LAB_003eb2ee:
    bVar5 = bVar6;
    Advance<char_const*>(current,separator,0x10,&local_98);
  }
  else if (**current == '-') {
    bVar6 = true;
    goto LAB_003eb2ee;
  }
  uVar12 = 0;
  do {
    uVar13 = (int)**current - 0x30;
    pDVar14 = (Double *)(ulong)uVar13;
    if (9 < uVar13) break;
    uVar13 = -uVar12;
    if (0 < (int)uVar12) {
      uVar13 = uVar12;
    }
    uVar4 = **current + -0x30 + uVar12 * 10;
    if (0x17bb0 < uVar13) {
      uVar4 = uVar12;
    }
    uVar12 = uVar4;
    bVar6 = Advance<char_const*>(current,separator,0x10,&local_98);
    pDVar14 = extraout_RDX;
  } while (!bVar6);
  uVar13 = -uVar12;
  if (!bVar5) {
    uVar13 = uVar12;
  }
  uVar8 = uVar13 + uVar8;
LAB_003eb365:
  if ((uVar8 != 0) && (this != (Double *)0x0)) {
    diy_fp.f_ = (ulong)uVar8;
    diy_fp._8_8_ = pDVar14;
    dVar18 = (double)Double::DiyFpToUint64(this,diy_fp);
    if ((char)local_90 != '\0') {
      return (double)((ulong)dVar18 ^ (ulong)DAT_02cc1a80);
    }
    return dVar18;
  }
  if ((char)local_90 != '\0') {
    if (this == (Double *)0x0) {
      return -0.0;
    }
    this = (Double *)-(long)this;
  }
  return (double)(long)this;
}

Assistant:

static double RadixStringToIeee(Iterator* current,
                                Iterator end,
                                bool sign,
                                uc16 separator,
                                bool parse_as_hex_float,
                                bool allow_trailing_junk,
                                double junk_string_value,
                                bool read_as_double,
                                bool* result_is_junk) {
  DOUBLE_CONVERSION_ASSERT(*current != end);
  DOUBLE_CONVERSION_ASSERT(!parse_as_hex_float ||
      IsHexFloatString(*current, end, separator, allow_trailing_junk));

  const int kDoubleSize = Double::kSignificandSize;
  const int kSingleSize = Single::kSignificandSize;
  const int kSignificandSize = read_as_double? kDoubleSize: kSingleSize;

  *result_is_junk = true;

  int64_t number = 0;
  int exponent = 0;
  const int radix = (1 << radix_log_2);
  // Whether we have encountered a '.' and are parsing the decimal digits.
  // Only relevant if parse_as_hex_float is true.
  bool post_decimal = false;

  // Skip leading 0s.
  while (**current == '0') {
    if (Advance(current, separator, radix, end)) {
      *result_is_junk = false;
      return SignedZero(sign);
    }
  }

  while (true) {
    int digit;
    if (IsDecimalDigitForRadix(**current, radix)) {
      digit = static_cast<char>(**current) - '0';
      if (post_decimal) exponent -= radix_log_2;
    } else if (IsCharacterDigitForRadix(**current, radix, 'a')) {
      digit = static_cast<char>(**current) - 'a' + 10;
      if (post_decimal) exponent -= radix_log_2;
    } else if (IsCharacterDigitForRadix(**current, radix, 'A')) {
      digit = static_cast<char>(**current) - 'A' + 10;
      if (post_decimal) exponent -= radix_log_2;
    } else if (parse_as_hex_float && **current == '.') {
      post_decimal = true;
      Advance(current, separator, radix, end);
      DOUBLE_CONVERSION_ASSERT(*current != end);
      continue;
    } else if (parse_as_hex_float && (**current == 'p' || **current == 'P')) {
      break;
    } else {
      if (allow_trailing_junk || !AdvanceToNonspace(current, end)) {
        break;
      } else {
        return junk_string_value;
      }
    }

    number = number * radix + digit;
    int overflow = static_cast<int>(number >> kSignificandSize);
    if (overflow != 0) {
      // Overflow occurred. Need to determine which direction to round the
      // result.
      int overflow_bits_count = 1;
      while (overflow > 1) {
        overflow_bits_count++;
        overflow >>= 1;
      }

      int dropped_bits_mask = ((1 << overflow_bits_count) - 1);
      int dropped_bits = static_cast<int>(number) & dropped_bits_mask;
      number >>= overflow_bits_count;
      exponent += overflow_bits_count;

      bool zero_tail = true;
      for (;;) {
        if (Advance(current, separator, radix, end)) break;
        if (parse_as_hex_float && **current == '.') {
          // Just run over the '.'. We are just trying to see whether there is
          // a non-zero digit somewhere.
          Advance(current, separator, radix, end);
          DOUBLE_CONVERSION_ASSERT(*current != end);
          post_decimal = true;
        }
        if (!isDigit(**current, radix)) break;
        zero_tail = zero_tail && **current == '0';
        if (!post_decimal) exponent += radix_log_2;
      }

      if (!parse_as_hex_float &&
          !allow_trailing_junk &&
          AdvanceToNonspace(current, end)) {
        return junk_string_value;
      }

      int middle_value = (1 << (overflow_bits_count - 1));
      if (dropped_bits > middle_value) {
        number++;  // Rounding up.
      } else if (dropped_bits == middle_value) {
        // Rounding to even to consistency with decimals: half-way case rounds
        // up if significant part is odd and down otherwise.
        if ((number & 1) != 0 || !zero_tail) {
          number++;  // Rounding up.
        }
      }

      // Rounding up may cause overflow.
      if ((number & ((int64_t)1 << kSignificandSize)) != 0) {
        exponent++;
        number >>= 1;
      }
      break;
    }
    if (Advance(current, separator, radix, end)) break;
  }

  DOUBLE_CONVERSION_ASSERT(number < ((int64_t)1 << kSignificandSize));
  DOUBLE_CONVERSION_ASSERT(static_cast<int64_t>(static_cast<double>(number)) == number);

  *result_is_junk = false;

  if (parse_as_hex_float) {
    DOUBLE_CONVERSION_ASSERT(**current == 'p' || **current == 'P');
    Advance(current, separator, radix, end);
    DOUBLE_CONVERSION_ASSERT(*current != end);
    bool is_negative = false;
    if (**current == '+') {
      Advance(current, separator, radix, end);
      DOUBLE_CONVERSION_ASSERT(*current != end);
    } else if (**current == '-') {
      is_negative = true;
      Advance(current, separator, radix, end);
      DOUBLE_CONVERSION_ASSERT(*current != end);
    }
    int written_exponent = 0;
    while (IsDecimalDigitForRadix(**current, 10)) {
      // No need to read exponents if they are too big. That could potentially overflow
      // the `written_exponent` variable.
      if (abs(written_exponent) <= 100 * Double::kMaxExponent) {
        written_exponent = 10 * written_exponent + **current - '0';
      }
      if (Advance(current, separator, radix, end)) break;
    }
    if (is_negative) written_exponent = -written_exponent;
    exponent += written_exponent;
  }

  if (exponent == 0 || number == 0) {
    if (sign) {
      if (number == 0) return -0.0;
      number = -number;
    }
    return static_cast<double>(number);
  }

  DOUBLE_CONVERSION_ASSERT(number != 0);
  double result = Double(DiyFp(number, exponent)).value();
  return sign ? -result : result;
}